

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Mitsukeru::
Index_Storage_Memory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
::search(Index_Storage_Memory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *term)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  iterator iVar1;
  mapped_type *pmVar2;
  pointer __x;
  
  this_01 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
  (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->terms;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::find(&this_00->_M_t,term);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->terms)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,term);
    __x = (pmVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start;
    while( true ) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](this_00,term);
      if (__x == (pmVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_01,__x);
      __x = __x + 1;
    }
  }
  return this_01;
}

Assistant:

std::vector< Data_T >* search(Term_T term)
    {
      std::vector< Data_T >* result = new std::vector< Data_T >;

      if (terms.find(term) != terms.end()) {
        for (typename std::vector< Data_T >::iterator it=terms[term].begin();it!=terms[term].end();++it) {
          result->push_back(*it);
        }
      }

      return result;
    }